

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

void Au_ManCountThings(Au_Man_t *p)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  Au_Ntk_t *pAVar6;
  Au_Obj_t *p_00;
  Au_Ntk_t *pAVar7;
  int i;
  
  i = (p->vNtks).nSize;
  do {
    if (i < 2) {
      pAVar6 = Au_ManNtkRoot(p);
      printf("Total nodes = %15.0f. Total instances = %15.0f. Total ports = %15.0f.\n",
             pAVar6->nNodes,pAVar6->nBoxes,pAVar6->nPorts);
      printf("Total ANDs  = %15.0f.\n",pAVar6->nNodeAnds);
      printf("Total XORs  = %15.0f.\n",pAVar6->nNodeXors);
      printf("Total MUXes = %15.0f.\n",pAVar6->nNodeMuxs);
      return;
    }
    i = i + -1;
    pAVar6 = (Au_Ntk_t *)Vec_PtrEntry(&p->vNtks,i);
    uVar1 = *(undefined8 *)(pAVar6->nObjs + 6);
    pAVar6->nBoxes = (double)(int)uVar1;
    pAVar6->nNodes = (double)(int)((ulong)uVar1 >> 0x20);
    pAVar6->nPorts = (double)(pAVar6->nObjs[3] + pAVar6->nObjs[2]);
    iVar4 = Au_NtkNodeNumFunc(pAVar6,1);
    pAVar6->nNodeAnds = (double)iVar4;
    iVar4 = Au_NtkNodeNumFunc(pAVar6,2);
    pAVar6->nNodeXors = (double)iVar4;
    iVar4 = Au_NtkNodeNumFunc(pAVar6,3);
    pAVar6->nNodeMuxs = (double)iVar4;
    for (iVar4 = 0; iVar4 < (pAVar6->vObjs).nSize; iVar4 = iVar4 + 1) {
      p_00 = Au_NtkObjI(pAVar6,iVar4);
      if ((((undefined1  [16])*p_00 & (undefined1  [16])0x700000000) ==
           (undefined1  [16])0x600000000) &&
         (pAVar7 = Au_ObjModel(p_00), pAVar7 != pAVar6 && pAVar7 != (Au_Ntk_t *)0x0)) {
        if (pAVar7->nObjs[2] != (uint)((ulong)*(undefined8 *)p_00 >> 0x23)) {
          __assert_fail("Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcHieNew.c"
                        ,0x200,"void Au_ManCountThings(Au_Man_t *)");
        }
        iVar5 = Au_BoxFanoutNum(p_00);
        if (iVar5 != pAVar7->nObjs[3]) {
          __assert_fail("Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcHieNew.c"
                        ,0x201,"void Au_ManCountThings(Au_Man_t *)");
        }
        if (pAVar7->Id <= pAVar6->Id) {
          __assert_fail("pBoxModel->Id > pNtk->Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcHieNew.c"
                        ,0x202,"void Au_ManCountThings(Au_Man_t *)");
        }
        dVar2 = pAVar7->nPorts;
        if (dVar2 <= 0.0) {
          __assert_fail("pBoxModel->nPorts > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcHieNew.c"
                        ,0x203,"void Au_ManCountThings(Au_Man_t *)");
        }
        dVar3 = pAVar7->nNodes;
        pAVar6->nBoxes = pAVar6->nBoxes + pAVar7->nBoxes;
        pAVar6->nNodes = pAVar6->nNodes + dVar3;
        dVar3 = pAVar7->nNodeAnds;
        pAVar6->nPorts = dVar2 + pAVar6->nPorts;
        pAVar6->nNodeAnds = dVar3 + pAVar6->nNodeAnds;
        dVar2 = pAVar7->nNodeMuxs;
        pAVar6->nNodeXors = pAVar7->nNodeXors + pAVar6->nNodeXors;
        pAVar6->nNodeMuxs = dVar2 + pAVar6->nNodeMuxs;
      }
    }
  } while( true );
}

Assistant:

void Au_ManCountThings( Au_Man_t * p )
{
    Au_Ntk_t * pNtk, * pBoxModel;
    Au_Obj_t * pBox;
    int i, k;//, clk = Abc_Clock();
    Au_ManForEachNtkReverse( p, pNtk, i )
    {
        pNtk->nBoxes = Au_NtkBoxNum(pNtk);
        pNtk->nNodes = Au_NtkNodeNum(pNtk);
        pNtk->nPorts = Au_NtkPiNum(pNtk) + Au_NtkPoNum(pNtk);
        pNtk->nNodeAnds = Au_NtkNodeNumFunc( pNtk, 1 );
        pNtk->nNodeXors = Au_NtkNodeNumFunc( pNtk, 2 );
        pNtk->nNodeMuxs = Au_NtkNodeNumFunc( pNtk, 3 );
//        assert( pNtk->nNodes == pNtk->nNodeAnds + pNtk->nNodeXors + pNtk->nNodeMuxs );
//        printf( "adding %.0f nodes of model %s\n", pNtk->nNodes, Au_NtkName(pNtk) );
        Au_NtkForEachBox( pNtk, pBox, k )
        {
            pBoxModel = Au_ObjModel(pBox);
            if ( pBoxModel == NULL || pBoxModel == pNtk )
                continue;
            assert( Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel) );
            assert( Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel) );
            assert( pBoxModel->Id > pNtk->Id );
            assert( pBoxModel->nPorts > 0 );
            pNtk->nBoxes += pBoxModel->nBoxes;
            pNtk->nNodes += pBoxModel->nNodes;
            pNtk->nPorts += pBoxModel->nPorts;
            pNtk->nNodeAnds += pBoxModel->nNodeAnds;
            pNtk->nNodeXors += pBoxModel->nNodeXors;
            pNtk->nNodeMuxs += pBoxModel->nNodeMuxs;
//            printf( "    adding %.0f nodes of model %s\n", pBoxModel->nNodes, Au_NtkName(pBoxModel) );
        }
//        printf( "total %.0f nodes in model %s\n", pNtk->nNodes, Au_NtkName(pNtk) );
    }
    pNtk = Au_ManNtkRoot(p);
    printf( "Total nodes = %15.0f. Total instances = %15.0f. Total ports = %15.0f.\n", 
//    printf( "Total nodes = %.2e. Total instances = %.2e. Total ports = %.2e.\n", 
        pNtk->nNodes, pNtk->nBoxes, pNtk->nPorts );
//    printf( "Total ANDs  = %15.0f. Total XORs      = %15.0f. Total MUXes = %15.0f.\n", 
//    printf( "Total ANDs  = %.2e. Total XORs      = %.2e. Total MUXes = %.2e.  ", 
//        pNtk->nNodeAnds, pNtk->nNodeXors, pNtk->nNodeMuxs );
    printf( "Total ANDs  = %15.0f.\n", pNtk->nNodeAnds );
    printf( "Total XORs  = %15.0f.\n", pNtk->nNodeXors );
    printf( "Total MUXes = %15.0f.\n", pNtk->nNodeMuxs );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}